

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TabItemBackground(ImDrawList *draw_list,ImRect *bb,ImGuiTabItemFlags flags,ImU32 col)

{
  ImVec2 *pIVar1;
  ImGuiContext *pIVar2;
  ImU32 col_00;
  ImVec2 *pIVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  ImVec2 local_60;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  
  pIVar2 = GImGui;
  fVar9 = (bb->Min).x;
  local_58._4_4_ = 0.0;
  fVar10 = (GImGui->Style).TabRounding;
  fVar11 = -1.0;
  fVar8 = ((bb->Max).x - fVar9) * 0.5 + -1.0;
  if (fVar8 <= fVar10) {
    fVar10 = fVar8;
  }
  local_48 = ZEXT416(~-(uint)(fVar10 <= 0.0) & (uint)fVar10);
  if (((uint)flags >> 0x16 & 1) != 0) {
    fVar11 = 0.0;
  }
  local_58._0_4_ = (bb->Min).y + 1.0;
  fVar11 = fVar11 + (bb->Max).y;
  iVar6 = (draw_list->_Path).Size;
  if (iVar6 == (draw_list->_Path).Capacity) {
    _local_58 = ZEXT416((uint)local_58._0_4_);
    if (iVar6 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar6 / 2 + iVar6;
    }
    iVar7 = iVar6 + 1;
    if (iVar6 + 1 < iVar5) {
      iVar7 = iVar5;
    }
    pIVar3 = (ImVec2 *)MemAlloc((long)iVar7 << 3);
    pIVar1 = (draw_list->_Path).Data;
    if (pIVar1 != (ImVec2 *)0x0) {
      memcpy(pIVar3,pIVar1,(long)(draw_list->_Path).Size << 3);
      MemFree((draw_list->_Path).Data);
    }
    (draw_list->_Path).Data = pIVar3;
    (draw_list->_Path).Capacity = iVar7;
    iVar6 = (draw_list->_Path).Size;
  }
  else {
    pIVar3 = (draw_list->_Path).Data;
  }
  pIVar3[iVar6].x = fVar9;
  pIVar3[iVar6].y = fVar11;
  (draw_list->_Path).Size = (draw_list->_Path).Size + 1;
  fVar9 = (bb->Min).x + (float)local_48._0_4_;
  fVar10 = (float)local_58._0_4_ + (float)local_48._0_4_;
  fStack_4c = (float)local_58._4_4_ + (float)local_48._0_4_;
  local_58._4_4_ = fVar10;
  local_58._0_4_ = fVar9;
  fStack_50 = (float)local_48._0_4_ + 0.0;
  local_60.y = fVar10;
  local_60.x = fVar9;
  ImDrawList::PathArcToFast(draw_list,&local_60,(float)local_48._0_4_,6,9);
  local_60.x = (bb->Max).x - (float)local_48._0_4_;
  ImDrawList::PathArcToFast(draw_list,&local_60,(float)local_48._0_4_,9,0xc);
  fVar9 = (bb->Max).x;
  iVar6 = (draw_list->_Path).Size;
  if (iVar6 == (draw_list->_Path).Capacity) {
    if (iVar6 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar6 / 2 + iVar6;
    }
    iVar7 = iVar6 + 1;
    if (iVar6 + 1 < iVar5) {
      iVar7 = iVar5;
    }
    pIVar3 = (ImVec2 *)MemAlloc((long)iVar7 << 3);
    pIVar1 = (draw_list->_Path).Data;
    if (pIVar1 != (ImVec2 *)0x0) {
      memcpy(pIVar3,pIVar1,(long)(draw_list->_Path).Size << 3);
      MemFree((draw_list->_Path).Data);
    }
    (draw_list->_Path).Data = pIVar3;
    (draw_list->_Path).Capacity = iVar7;
    iVar6 = (draw_list->_Path).Size;
  }
  else {
    pIVar3 = (draw_list->_Path).Data;
  }
  pIVar3[iVar6].x = fVar9;
  pIVar3[iVar6].y = fVar11;
  iVar6 = (draw_list->_Path).Size + 1;
  (draw_list->_Path).Size = iVar6;
  ImDrawList::AddConvexPolyFilled(draw_list,(draw_list->_Path).Data,iVar6,col);
  (draw_list->_Path).Size = 0;
  if (0.0 < (pIVar2->Style).TabBorderSize) {
    fVar9 = (bb->Min).x;
    if ((draw_list->_Path).Capacity == 0) {
      pIVar3 = (ImVec2 *)MemAlloc(0x40);
      pIVar1 = (draw_list->_Path).Data;
      if (pIVar1 != (ImVec2 *)0x0) {
        memcpy(pIVar3,pIVar1,(long)(draw_list->_Path).Size << 3);
        MemFree((draw_list->_Path).Data);
      }
      (draw_list->_Path).Data = pIVar3;
      (draw_list->_Path).Capacity = 8;
      lVar4 = (long)(draw_list->_Path).Size;
    }
    else {
      pIVar3 = (draw_list->_Path).Data;
      lVar4 = 0;
    }
    pIVar3[lVar4].x = fVar9 + 0.5;
    pIVar3[lVar4].y = fVar11;
    (draw_list->_Path).Size = (draw_list->_Path).Size + 1;
    local_58._0_4_ = (bb->Min).x + (float)local_48._0_4_ + 0.5;
    local_58._4_4_ = (float)local_58._4_4_ + 0.5;
    fStack_50 = fStack_50 + 0.0;
    fStack_4c = fStack_4c + 0.0;
    local_60.y = (float)local_58._4_4_;
    local_60.x = (float)local_58._0_4_;
    ImDrawList::PathArcToFast(draw_list,&local_60,(float)local_48._0_4_,6,9);
    local_60.y = (float)local_58._4_4_;
    local_60.x = ((bb->Max).x - (float)local_48._0_4_) + -0.5;
    ImDrawList::PathArcToFast(draw_list,&local_60,(float)local_48._0_4_,9,0xc);
    fVar9 = (bb->Max).x;
    iVar6 = (draw_list->_Path).Size;
    if (iVar6 == (draw_list->_Path).Capacity) {
      if (iVar6 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar6 / 2 + iVar6;
      }
      iVar7 = iVar6 + 1;
      if (iVar6 + 1 < iVar5) {
        iVar7 = iVar5;
      }
      pIVar3 = (ImVec2 *)MemAlloc((long)iVar7 << 3);
      pIVar1 = (draw_list->_Path).Data;
      if (pIVar1 != (ImVec2 *)0x0) {
        memcpy(pIVar3,pIVar1,(long)(draw_list->_Path).Size << 3);
        MemFree((draw_list->_Path).Data);
      }
      (draw_list->_Path).Data = pIVar3;
      (draw_list->_Path).Capacity = iVar7;
      iVar6 = (draw_list->_Path).Size;
    }
    else {
      pIVar3 = (draw_list->_Path).Data;
    }
    pIVar3[iVar6].x = fVar9 + -0.5;
    pIVar3[iVar6].y = fVar11;
    (draw_list->_Path).Size = (draw_list->_Path).Size + 1;
    col_00 = GetColorU32(5,1.0);
    ImDrawList::AddPolyline<ImVec2>
              (draw_list,(draw_list->_Path).Data,(draw_list->_Path).Size,col_00,false,
               (pIVar2->Style).TabBorderSize);
    (draw_list->_Path).Size = 0;
  }
  return;
}

Assistant:

void ImGui::TabItemBackground(ImDrawList* draw_list, const ImRect& bb, ImGuiTabItemFlags flags, ImU32 col)
{
    // While rendering tabs, we trim 1 pixel off the top of our bounding box so they can fit within a regular frame height while looking "detached" from it.
    ImGuiContext& g = *GImGui;
    const float width = bb.GetWidth();
    IM_UNUSED(flags);
    IM_ASSERT(width > 0.0f);
    const float rounding = ImMax(0.0f, ImMin(g.Style.TabRounding, width * 0.5f - 1.0f));
    const float y1 = bb.Min.y + 1.0f;
    const float y2 = bb.Max.y + ((flags & ImGuiTabItemFlags_Preview) ? 0.0f : -1.0f);
    draw_list->PathLineTo(ImVec2(bb.Min.x, y2));
    draw_list->PathArcToFast(ImVec2(bb.Min.x + rounding, y1 + rounding), rounding, 6, 9);
    draw_list->PathArcToFast(ImVec2(bb.Max.x - rounding, y1 + rounding), rounding, 9, 12);
    draw_list->PathLineTo(ImVec2(bb.Max.x, y2));
    draw_list->PathFillConvex(col);
    if (g.Style.TabBorderSize > 0.0f)
    {
        draw_list->PathLineTo(ImVec2(bb.Min.x + 0.5f, y2));
        draw_list->PathArcToFast(ImVec2(bb.Min.x + rounding + 0.5f, y1 + rounding + 0.5f), rounding, 6, 9);
        draw_list->PathArcToFast(ImVec2(bb.Max.x - rounding - 0.5f, y1 + rounding + 0.5f), rounding, 9, 12);
        draw_list->PathLineTo(ImVec2(bb.Max.x - 0.5f, y2));
        draw_list->PathStroke(GetColorU32(ImGuiCol_Border), false, g.Style.TabBorderSize);
    }
}